

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

int GetIArg(int *i,int argc,char **argv)

{
  int iVar1;
  string errstr;
  string str;
  
  GetNextArg_abi_cxx11_(&str,i,argc,argv);
  iVar1 = std::__cxx11::stoi(&str,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&str);
  return iVar1;
}

Assistant:

int GetIArg(int & i, int argc, char ** argv)
{   
    std::string str = GetNextArg(i, argc, argv);
    try {

        return stoi(str);
    }
    catch(...)
    {
        std::string errstr("Cannot convert to int: ");
        errstr += str;
        throw std::runtime_error(errstr);
    }
}